

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::setGeometry(QWidget *this,QRect *r)

{
  ushort *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QWidgetPrivate *this_00;
  long lVar8;
  QWidgetData *pQVar9;
  QWExtra *pQVar10;
  QWidgetPrivate *d_4;
  int iVar11;
  int iVar12;
  undefined8 uVar13;
  QWidgetPrivate *d;
  int iVar14;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  if ((this_00->high_attributes[0] >> 10 & 1) == 0) {
    this_00->high_attributes[0] = this_00->high_attributes[0] | 0x400;
  }
  if ((this_00->high_attributes[0] >> 0xb & 1) == 0) {
    this_00->high_attributes[0] = this_00->high_attributes[0] | 0x800;
  }
  if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
    QWidgetPrivate::createTLExtra(this_00);
    puVar1 = (ushort *)
             ((long)(((this_00->extra)._M_t.
                      super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                    super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0xe0);
    *puVar1 = *puVar1 & 0xfeff;
  }
  lVar8 = *(long *)&this->field_0x8;
  if ((*(byte *)(lVar8 + 0x243) & 0x10) == 0) {
    pQVar9 = this->data;
    iVar2 = (pQVar9->crect).x1.m_i;
    iVar3 = (pQVar9->crect).y1.m_i;
    iVar4 = (pQVar9->crect).x2.m_i;
    iVar5 = (pQVar9->crect).y2.m_i;
    iVar6 = (r->x1).m_i;
    iVar7 = (r->y1).m_i;
    (pQVar9->crect).x1.m_i = iVar6;
    (pQVar9->crect).y1.m_i = iVar7;
    iVar11 = ((r->x2).m_i - (r->x1).m_i) + 1;
    iVar12 = ((r->y2).m_i - (r->y1).m_i) + 1;
    lVar8 = *(long *)(lVar8 + 0x78);
    if (lVar8 == 0) {
      uVar13 = 0xffffff00ffffff;
    }
    else {
      uVar13 = *(undefined8 *)(lVar8 + 0x68);
    }
    if ((int)uVar13 <= iVar11) {
      iVar11 = (int)uVar13;
    }
    iVar14 = (int)((ulong)uVar13 >> 0x20);
    if (iVar12 < iVar14) {
      iVar14 = iVar12;
    }
    if (lVar8 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = *(undefined8 *)(lVar8 + 0x60);
    }
    if (iVar11 <= (int)uVar13) {
      iVar11 = (int)uVar13;
    }
    iVar12 = (int)((ulong)uVar13 >> 0x20);
    if (iVar12 < iVar14) {
      iVar12 = iVar14;
    }
    (pQVar9->crect).x2.m_i = iVar6 + -1 + iVar11;
    (pQVar9->crect).y2.m_i = iVar7 + iVar12 + -1;
    pQVar9 = this->data;
    if ((((iVar2 != (pQVar9->crect).x1.m_i) || (iVar4 != (pQVar9->crect).x2.m_i)) ||
        (iVar3 != (pQVar9->crect).y1.m_i)) || (iVar5 != (pQVar9->crect).y2.m_i)) {
      lVar8 = *(long *)&this->field_0x8;
      if ((*(uint *)(lVar8 + 0x240) & 4) == 0) {
        *(uint *)(lVar8 + 0x240) = *(uint *)(lVar8 + 0x240) | 4;
      }
      if ((*(uint *)(lVar8 + 0x240) & 8) == 0) {
        *(uint *)(lVar8 + 0x240) = *(uint *)(lVar8 + 0x240) | 8;
      }
    }
  }
  else {
    iVar2 = (r->x1).m_i;
    iVar3 = (r->y1).m_i;
    QWidgetPrivate::setGeometry_sys
              (this_00,iVar2,iVar3,((r->x2).m_i - iVar2) + 1,((r->y2).m_i - iVar3) + 1,true);
    QWidgetPrivate::setDirtyOpaqueRegion(this_00);
  }
  pQVar10 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t
            .super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
            super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if ((pQVar10 != (QWExtra *)0x0) && ((pQVar10->field_0x7d & 1) != 0)) {
    QWindowContainer::parentWasMoved(this);
    return;
  }
  return;
}

Assistant:

void QWidget::setGeometry(const QRect &r)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_Resized);
    setAttribute(Qt::WA_Moved);
    if (isWindow())
        d->topData()->posIncludesFrame = 0;
    if (testAttribute(Qt::WA_WState_Created)) {
        d->setGeometry_sys(r.x(), r.y(), r.width(), r.height(), true);
        d->setDirtyOpaqueRegion();
    } else {
        const auto oldRect = data->crect;
        data->crect.setTopLeft(r.topLeft());
        data->crect.setSize(r.size().boundedTo(maximumSize()).expandedTo(minimumSize()));
        if (oldRect != data->crect) {
            setAttribute(Qt::WA_PendingMoveEvent);
            setAttribute(Qt::WA_PendingResizeEvent);
        }
    }

    if (d->extra && d->extra->hasWindowContainer)
        QWindowContainer::parentWasMoved(this);
}